

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_complex_double_split_array
              (coda_cursor_conflict *cursor,double *dst_re,double *dst_im,
              coda_array_ordering array_ordering)

{
  bool bVar1;
  int iVar2;
  coda_type *pcVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int num_dims;
  uint8_t buffer [16];
  long dim [8];
  coda_cursor_conflict array_cursor;
  int local_404;
  ulong local_400;
  double local_3f8;
  double local_3f0;
  long alStack_3e8 [12];
  long local_388 [9];
  coda_cursor_conflict local_340;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (pcVar3 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar3 == (coda_type *)0x0)) {
    pcVar5 = "invalid cursor argument (%s:%u)";
    uVar8 = 0x1651;
  }
  else if (dst_re == (double *)0x0) {
    pcVar5 = "dst_re argument is NULL (%s:%u)";
    uVar8 = 0x1656;
  }
  else {
    if (dst_im != (double *)0x0) {
      if (99 < pcVar3->format) {
        pcVar3 = *(coda_type **)&pcVar3->type_class;
      }
      if (pcVar3->type_class != coda_array_class) {
        pcVar5 = coda_type_get_class_name(pcVar3->type_class);
        coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar5);
        return -1;
      }
      iVar2 = coda_cursor_get_array_dim(cursor,&local_404,local_388);
      if (iVar2 != 0) {
        return -1;
      }
      memcpy(&local_340,cursor,0x310);
      lVar4 = (long)local_404;
      if (array_ordering == coda_array_ordering_fortran && 1 < lVar4) {
        alStack_3e8[2] = 1;
        lVar7 = 1;
        lVar9 = 0;
        do {
          lVar7 = lVar7 * local_388[lVar9];
          alStack_3e8[lVar9 + 3] = lVar7;
          lVar9 = lVar9 + 1;
        } while (lVar4 != lVar9);
        local_400 = alStack_3e8[lVar4 + 2];
        if (0 < (long)local_400) {
          alStack_3e8[1] = alStack_3e8[lVar4 + 1];
          iVar2 = coda_cursor_goto_array_element_by_index(&local_340,0);
          if (iVar2 != 0) {
            return -1;
          }
          lVar7 = 0;
          lVar4 = 0;
          do {
            do {
              do {
                read_double_pair(&local_340,&local_3f8);
                dst_re[lVar4] = local_3f8;
                dst_im[lVar4] = local_3f0;
                lVar7 = lVar7 + 1;
                if ((lVar7 < (long)local_400) &&
                   (iVar2 = coda_cursor_goto_next_array_element(&local_340), iVar2 != 0)) {
                  return -1;
                }
                lVar4 = lVar4 + alStack_3e8[1];
              } while (lVar4 < (long)local_400);
              if (lVar7 == local_400) {
                return 0;
              }
              lVar9 = (long)local_404;
              lVar4 = (lVar4 + alStack_3e8[lVar9]) - alStack_3e8[lVar9 + 2];
            } while (lVar9 < 3);
            lVar9 = (ulong)(local_404 - 3) + 1;
            do {
              if (lVar4 < alStack_3e8[lVar9 + 3]) break;
              lVar4 = (lVar4 - alStack_3e8[lVar9 + 3]) + alStack_3e8[lVar9 + 1];
              lVar6 = lVar9 + -1;
              bVar1 = 0 < lVar9;
              lVar9 = lVar6;
            } while (lVar6 != 0 && bVar1);
          } while( true );
        }
      }
      else {
        uVar10 = 1;
        if (0 < local_404) {
          lVar7 = 0;
          do {
            uVar10 = uVar10 * local_388[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar4 != lVar7);
          if ((long)uVar10 < 1) {
            return 0;
          }
        }
        iVar2 = coda_cursor_goto_array_element_by_index(&local_340,0);
        if (iVar2 != 0) {
          return -1;
        }
        local_400 = uVar10 - 1;
        uVar11 = 0;
        do {
          read_double_pair(&local_340,&local_3f8);
          dst_re[uVar11] = local_3f8;
          dst_im[uVar11] = local_3f0;
          if ((uVar11 < local_400) &&
             (iVar2 = coda_cursor_goto_next_array_element(&local_340), iVar2 != 0)) {
            return -1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      return 0;
    }
    pcVar5 = "dst_im argument is NULL (%s:%u)";
    uVar8 = 0x165b;
  }
  coda_set_error(-100,pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar8);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_complex_double_split_array(const coda_cursor *cursor, double *dst_re, double *dst_im,
                                                            coda_array_ordering array_ordering)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_re == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_re argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_im == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_im argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    return read_split_array(cursor, (read_function)&read_double_pair, (uint8_t *)dst_re, (uint8_t *)dst_im,
                            sizeof(double), array_ordering);
}